

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

int log_series_cdf_inv(double cdf,double a)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    iVar3 = 1;
    dVar6 = 0.0;
    if (0.0 < cdf) {
      dVar5 = 1.0 - a;
      uVar2 = 0;
      do {
        uVar1 = uVar2;
        uVar2 = uVar1 + 1;
        if (uVar1 == 0) {
          dVar4 = log(1.0 - a);
          dVar5 = -a;
        }
        else {
          dVar4 = (double)(int)uVar2;
          dVar5 = dVar5 * (double)(int)uVar1 * a;
        }
        dVar5 = dVar5 / dVar4;
        dVar6 = dVar6 + dVar5;
      } while ((dVar6 < cdf) && (uVar2 < 999));
      iVar3 = uVar1 + 2;
    }
    return iVar3;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"LOG_SERIES_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int log_series_cdf_inv ( double cdf, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_SERIES_CDF_INV inverts the Logarithmic Series CDF.
//
//  Discussion:
//
//    Simple summation is used.  The only protection against an
//    infinite loop caused by roundoff is that X cannot be larger
//    than 1000.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A < 1.0.
//
//    Output, double LOG_SERIES_CDF_INV, the argument X of the CDF for which
//    CDF(X-1) <= CDF <= CDF(X).
//
{
  double cdf2;
  double pdf;
  int x;
  int xmax = 1000;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "LOG_SERIES_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cdf2 = 0.0;
  x = 1;

  while ( cdf2 < cdf && x < xmax )
  {
    if ( x == 1 )
    {
      pdf = - a / log ( 1.0 - a );
    }
    else
    {
      pdf = static_cast<double>(x - 1 ) * a * pdf / static_cast<double>(x );
    }

    cdf2 = cdf2 + pdf;

    x = x + 1;
  }
  return x;
}